

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O0

int string_to_parts(char *format,char *str,int *year,int *month,int *day,int *hour,int *minute,
                   int *second,int *musec)

{
  int iVar1;
  bool bVar2;
  int local_6c;
  int local_58;
  int local_54;
  int day_of_year;
  int n;
  int literal;
  int string_index;
  int format_index;
  int use_leading_spaces;
  int *hour_local;
  int *day_local;
  int *month_local;
  int *year_local;
  char *str_local;
  char *format_local;
  
  literal = 0;
  n = 0;
  day_of_year = 0;
  *year = 2000;
  *month = 1;
  *day = 1;
  *hour = 0;
  *minute = 0;
  *second = 0;
  *musec = 0;
  _format_index = hour;
  hour_local = day;
  day_local = month;
  month_local = year;
  year_local = (int *)str;
  str_local = format;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                bVar2 = false;
                if ((str_local[literal] != '\0') && (bVar2 = true, day_of_year == 0)) {
                  bVar2 = str_local[literal] != '|';
                }
                if (!bVar2) {
                  if (day_of_year != 0) {
                    coda_set_error(-0x67,"missing closing \' in date/time format (%s)",str_local);
                    return -1;
                  }
                  if (*(char *)((long)year_local + (long)n) != '\0') {
                    coda_set_error(-0x68,
                                   "date/time argument (%s) contains additional characters (format: %s)"
                                   ,year_local,str_local);
                    return -1;
                  }
                  return 0;
                }
                if ((str_local[literal] != '\'') ||
                   (literal = literal + 1, str_local[literal] == '\'')) break;
                day_of_year = (int)((day_of_year != 0 ^ 0xffU) & 1);
              }
              if (day_of_year == 0) break;
              if (str_local[literal] != *(char *)((long)year_local + (long)n)) {
                coda_set_error(-0x68,
                               "date/time argument (%s) has an incorrect fixed character (format: %s)"
                               ,year_local,str_local);
                return -1;
              }
              literal = literal + 1;
              n = n + 1;
            }
            if ((((str_local[literal] != 'y') || (str_local[literal + 1] != 'y')) ||
                (str_local[literal + 2] != 'y')) || (str_local[literal + 3] != 'y')) break;
            string_index = (int)(str_local[literal + 4] == '*');
            iVar1 = parse_integer((char *)((long)year_local + (long)n),4,string_index,month_local);
            if (iVar1 != 0) {
              coda_set_error(-0x68,
                             "date/time argument (%s) has an incorrect year value (format: %s)",
                             year_local,str_local);
              return -1;
            }
            literal = (str_local[literal] == '*') + 4 + literal;
            n = n + 4;
          }
          if ((str_local[literal] != 'M') || (str_local[literal + 1] != 'M')) break;
          if (str_local[literal + 2] == 'M') {
            iVar1 = coda_month_to_integer((char *)((long)year_local + (long)n));
            *day_local = iVar1;
            if (*day_local == -1) {
              coda_set_error(-0x68,
                             "date/time argument (%s) has an incorrect month value (format: %s)",
                             year_local,str_local);
              return -1;
            }
            literal = literal + 3;
            n = n + 3;
          }
          else {
            string_index = (int)(str_local[literal + 2] == '*');
            iVar1 = parse_integer((char *)((long)year_local + (long)n),2,string_index,day_local);
            if (iVar1 != 0) {
              coda_set_error(-0x68,
                             "date/time argument (%s) has an incorrect month value (format: %s)",
                             year_local,str_local);
              return -1;
            }
            literal = (str_local[literal + 2] == '*') + 2 + literal;
            n = n + 2;
          }
        }
        if ((str_local[literal] != 'd') || (str_local[literal + 1] != 'd')) break;
        string_index = (int)(str_local[literal + 2] == '*');
        iVar1 = parse_integer((char *)((long)year_local + (long)n),2,string_index,hour_local);
        if (iVar1 != 0) {
          coda_set_error(-0x68,"date/time argument (%s) has an incorrect day value (format: %s)",
                         year_local,str_local);
          return -1;
        }
        literal = (str_local[literal + 2] == '*') + 2 + literal;
        n = n + 2;
      }
      if (((str_local[literal] == 'D') && (str_local[literal + 1] == 'D')) &&
         (str_local[literal + 2] == 'D')) break;
      if ((str_local[literal] == 'H') && (str_local[literal + 1] == 'H')) {
        string_index = (int)(str_local[literal + 2] == '*');
        iVar1 = parse_integer((char *)((long)year_local + (long)n),2,string_index,_format_index);
        if (iVar1 != 0) {
          coda_set_error(-0x68,"date/time argument (%s) has an incorrect hour value (format: %s)",
                         year_local,str_local);
          return -1;
        }
        literal = (str_local[literal + 2] == '*') + 2 + literal;
        n = n + 2;
      }
      else if ((str_local[literal] == 'm') && (str_local[literal + 1] == 'm')) {
        string_index = (int)(str_local[literal + 2] == '*');
        iVar1 = parse_integer((char *)((long)year_local + (long)n),2,string_index,minute);
        if (iVar1 != 0) {
          coda_set_error(-0x68,"date/time argument (%s) has an incorrect minute value (format: %s)",
                         year_local,str_local);
          return -1;
        }
        literal = (str_local[literal + 2] == '*') + 2 + literal;
        n = n + 2;
      }
      else if ((str_local[literal] == 's') && (str_local[literal + 1] == 's')) {
        string_index = (int)(str_local[literal + 2] == '*');
        iVar1 = parse_integer((char *)((long)year_local + (long)n),2,string_index,second);
        if (iVar1 != 0) {
          coda_set_error(-0x68,"date/time argument (%s) has an incorrect second value (format: %s)",
                         year_local,str_local);
          return -1;
        }
        literal = (str_local[literal + 2] == '*') + 2 + literal;
        n = n + 2;
      }
      else if (str_local[literal] == 'S') {
        local_54 = 0;
        for (; str_local[literal] == 'S'; literal = literal + 1) {
          local_54 = local_54 + 1;
        }
        if (local_54 < 7) {
          local_6c = local_54;
        }
        else {
          local_6c = 6;
        }
        iVar1 = parse_integer((char *)((long)year_local + (long)n),local_6c,0,musec);
        if (iVar1 != 0) {
          coda_set_error(-0x68,
                         "date/time argument (%s) has an incorrect fractional second value (format: %s)"
                         ,year_local,str_local);
          return -1;
        }
        n = local_54 + n;
        for (; local_54 < 6; local_54 = local_54 + 1) {
          *musec = *musec * 10;
        }
      }
      else {
        if (((('@' < str_local[literal]) && (str_local[literal] < '[')) ||
            (('`' < str_local[literal] && (str_local[literal] < '{')))) ||
           (str_local[literal] == '*')) {
          coda_set_error(-0x67,"unsuppored character sequence in date/time format (%s)",str_local);
          return -1;
        }
        if (str_local[literal] != *(char *)((long)year_local + (long)n)) {
          coda_set_error(-0x68,
                         "date/time argument (%s) has an incorrect fixed character (format: %s)",
                         year_local,str_local);
          return -1;
        }
        literal = literal + 1;
        n = n + 1;
      }
    }
    string_index = (int)(str_local[literal + 3] == '*');
    iVar1 = parse_integer((char *)((long)year_local + (long)n),3,string_index,&local_58);
    if (iVar1 != 0) {
      coda_set_error(-0x68,"date/time argument (%s) has an incorrect day value (format: %s)",
                     year_local,str_local);
      return -1;
    }
    iVar1 = coda_dayofyear_to_month_day(*month_local,local_58,day_local,hour_local);
    if (iVar1 != 0) break;
    literal = (str_local[literal + 3] == '*') + 3 + literal;
    n = n + 3;
  }
  coda_set_error(-0x68,"date/time argument (%s) has an invalid day value (format: %s)",year_local,
                 str_local);
  return -1;
}

Assistant:

static int string_to_parts(const char *format, const char *str, int *year, int *month, int *day, int *hour,
                           int *minute, int *second, int *musec)
{
    int use_leading_spaces;
    int format_index = 0;
    int string_index = 0;
    int literal = 0;
    int n;

    /* initialize with epoch 2000-01-01T00:00:00.000000 */
    *year = 2000;
    *month = 1;
    *day = 1;
    *hour = 0;
    *minute = 0;
    *second = 0;
    *musec = 0;

    while (format[format_index] != '\0' && (literal || format[format_index] != '|'))
    {
        if (format[format_index] == '\'')
        {
            format_index++;
            if (format[format_index] != '\'')
            {
                literal = !literal;
                continue;
            }
        }
        if (literal)
        {
            /* literal match */
            if (format[format_index] != str[string_index])
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fixed character "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index++;
            string_index++;
        }
        else if (format[format_index] == 'y' && format[format_index + 1] == 'y' && format[format_index + 2] == 'y' &&
                 format[format_index + 3] == 'y')
        {
            use_leading_spaces = format[format_index + 4] == '*';
            if (parse_integer(&str[string_index], 4, use_leading_spaces, year) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect year value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 4 + (format[format_index] == '*');
            string_index += 4;
        }
        else if (format[format_index] == 'M' && format[format_index + 1] == 'M')
        {
            if (format[format_index + 2] == 'M')
            {
                /* coda_month_to_integer already limits comparison to only 3 characters */
                *month = coda_month_to_integer(&str[string_index]);
                if (*month == -1)
                {
                    coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect month value "
                                   "(format: %s)", str, format);
                    return -1;
                }
                format_index += 3;
                string_index += 3;
            }
            else
            {
                use_leading_spaces = format[format_index + 2] == '*';
                if (parse_integer(&str[string_index], 2, use_leading_spaces, month) != 0)
                {
                    coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect month value "
                                   "(format: %s)", str, format);
                    return -1;
                }
                format_index += 2 + (format[format_index + 2] == '*');
                string_index += 2;
            }
        }
        else if (format[format_index] == 'd' && format[format_index + 1] == 'd')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, day) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect day value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'D' && format[format_index + 1] == 'D' && format[format_index + 2] == 'D')
        {
            int day_of_year;

            use_leading_spaces = format[format_index + 3] == '*';
            /* uses currently parsed year value to determine the actual month/day within the year */
            if (parse_integer(&str[string_index], 3, use_leading_spaces, &day_of_year) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect day value "
                               "(format: %s)", str, format);
                return -1;
            }
            if (coda_dayofyear_to_month_day(*year, day_of_year, month, day) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an invalid day value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 3 + (format[format_index + 3] == '*');
            string_index += 3;
        }
        else if (format[format_index] == 'H' && format[format_index + 1] == 'H')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, hour) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect hour value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'm' && format[format_index + 1] == 'm')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, minute) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect minute value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 's' && format[format_index + 1] == 's')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, second) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect second value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'S')
        {
            n = 0;
            while (format[format_index] == 'S')
            {
                format_index++;
                n++;
            }
            if (parse_integer(&str[string_index], n > 6 ? 6 : n, 0, musec) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fractional "
                               "second value (format: %s)", str, format);
                return -1;
            }
            string_index += n;
            while (n < 6)
            {
                *musec *= 10;
                n++;
            }
        }
        else if ((format[format_index] >= 'A' && format[format_index] <= 'Z') ||
                 (format[format_index] >= 'a' && format[format_index] <= 'z') || format[format_index] == '*')
        {
            /* reserved character */
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "unsuppored character sequence in date/time format (%s)", format);
            return -1;
        }
        else
        {
            /* literal match */
            if (format[format_index] != str[string_index])
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fixed character "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index++;
            string_index++;
        }
    }
    if (literal)
    {
        coda_set_error(CODA_ERROR_INVALID_FORMAT, "missing closing ' in date/time format (%s)", format);
        return -1;
    }
    if (str[string_index] != '\0')
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) contains additional characters "
                       "(format: %s)", str, format);
        return -1;
    }

    return 0;
}